

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word.c
# Opt level: O2

RSIZE countfword(void)

{
  int iVar1;
  line *plVar2;
  mgwin *pmVar3;
  int iVar4;
  int iVar5;
  
  plVar2 = curwp->w_dotp;
  iVar1 = curwp->w_doto;
  iVar5 = 0;
  while( true ) {
    iVar4 = inword();
    if (iVar4 == 0) break;
    iVar4 = forwchar(8,1);
    if (iVar4 == 0) break;
    iVar5 = iVar5 + 1;
  }
  pmVar3 = curwp;
  curwp->w_dotp = plVar2;
  pmVar3->w_doto = iVar1;
  return iVar5;
}

Assistant:

RSIZE
countfword()
{
	RSIZE		 size;
	struct line	*dotp;
	int		 doto;

	dotp = curwp->w_dotp;
	doto = curwp->w_doto;
	size = 0;

	while (inword() != FALSE) {
		if (forwchar(FFRAND, 1) == FALSE)
			/* hit the end of the buffer */
			goto out;
		++size;
	}
out:
	curwp->w_dotp = dotp;
	curwp->w_doto = doto;
	return (size);
}